

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.h
# Opt level: O1

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor_FeatureValueWeight::ByteSizeLong
          (BayesianProbitRegressor_FeatureValueWeight *this)

{
  BayesianProbitRegressor_Gaussian *pBVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  
  pBVar1 = this->featureweight_;
  if (pBVar1 == (BayesianProbitRegressor_Gaussian *)0x0 ||
      this == (BayesianProbitRegressor_FeatureValueWeight *)
              _BayesianProbitRegressor_FeatureValueWeight_default_instance_) {
    sVar4 = 0;
  }
  else {
    uVar5 = (ulong)(pBVar1->mean_ != 0.0);
    lVar6 = uVar5 * 9 + 9;
    if (pBVar1->precision_ == 0.0) {
      lVar6 = uVar5 * 9;
    }
    uVar5 = (pBVar1->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar5 & 1) != 0) {
      lVar6 = lVar6 + *(long *)((uVar5 & 0xfffffffffffffffc) + 0x10);
    }
    (pBVar1->_cached_size_).size_.super___atomic_base<int>._M_i = (uint)lVar6;
    uVar3 = (uint)lVar6 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = (ulong)(iVar2 * 9 + 0x49U >> 6) + lVar6 + 1;
  }
  if (this->featurevalue_ != 0) {
    uVar3 = this->featurevalue_ | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar4 = sVar4 + (iVar2 * 9 + 0x89U >> 6);
  }
  uVar5 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar5 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar5 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

inline bool BayesianProbitRegressor_FeatureValueWeight::_internal_has_featureweight() const {
  return this != internal_default_instance() && featureweight_ != nullptr;
}